

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_read_format_7zip.c
# Opt level: O1

void test_read_format_7zip_lzma2_arm(void)

{
  int iVar1;
  archive *_a;
  
  _a = archive_read_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_7zip.c"
                   ,L'є',(uint)(_a != (archive *)0x0),"(a = archive_read_new()) != NULL",
                   (void *)0x0);
  iVar1 = archive_read_support_filter_lzma(_a);
  if (iVar1 == 0) {
    test_arm_filter("test_read_format_7zip_lzma2_arm.7z");
  }
  else {
    skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_7zip.c"
                   ,L'ї');
    test_skipping("7zip:lzma decoding is not supported on this platform");
  }
  iVar1 = archive_read_free(_a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_7zip.c"
                      ,L'ѝ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",(void *)0x0);
  return;
}

Assistant:

DEFINE_TEST(test_read_format_7zip_lzma2_arm)
{
	struct archive *a;

	assert((a = archive_read_new()) != NULL);

	if (ARCHIVE_OK != archive_read_support_filter_lzma(a)) {
		skipping(
		    "7zip:lzma decoding is not supported on this platform");
	} else {
		test_arm_filter("test_read_format_7zip_lzma2_arm.7z");
	}

	assertEqualInt(ARCHIVE_OK, archive_read_free(a));
}